

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsPublication
helicsFederateRegisterGlobalTypePublication
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_view units_00;
  ValueFederate *pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  Publication *pPVar4;
  HelicsPublication pvVar5;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  string_view name;
  string_view type_00;
  __single_object pub;
  PublicationObject *local_70;
  _Head_base<0UL,_helics::PublicationObject_*,_false> local_68;
  size_type local_60;
  ValueFederate *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  HelicsError *local_48;
  size_t local_40;
  char *pcStack_38;
  
  local_48 = err;
  getValueFedSharedPtr(&local_58,(HelicsError *)fed);
  pVVar1 = local_58;
  if (local_58 == (ValueFederate *)0x0) {
    pvVar5 = (HelicsPublication)0x0;
  }
  else {
    local_70 = (PublicationObject *)operator_new(0x20);
    (local_70->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_70->pubPtr = (Publication *)0x0;
    *(undefined8 *)local_70 = 0;
    (local_70->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_60 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var6 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (key != (char *)0x0) {
      local_60 = strlen(key);
      _Var6._M_p = key;
    }
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var7._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (type != (char *)0x0) {
      sVar3 = strlen(type);
      _Var7._M_p = type;
    }
    local_40 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    pcStack_38 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (units != (char *)0x0) {
      local_40 = strlen(units);
      pcStack_38 = units;
    }
    units_00._M_str = pcStack_38;
    units_00._M_len = local_40;
    name._M_str = _Var6._M_p;
    name._M_len = local_60;
    type_00._M_str = _Var7._M_p;
    type_00._M_len = sVar3;
    pPVar4 = helics::ValueFederate::registerGlobalPublication(pVVar1,name,type_00,units_00);
    p_Var2 = p_Stack_50;
    pVVar1 = local_58;
    local_70->pubPtr = pPVar4;
    local_58 = (ValueFederate *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_70->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_70->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pVVar1;
    (local_70->fedptr).super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    local_68._M_head_impl = local_70;
    local_70 = (PublicationObject *)0x0;
    pvVar5 = anon_unknown.dwarf_7c6ff::addPublication
                       (fed,(unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                             *)&local_68);
    if (local_68._M_head_impl != (PublicationObject *)0x0) {
      std::default_delete<helics::PublicationObject>::operator()
                ((default_delete<helics::PublicationObject> *)&local_68,local_68._M_head_impl);
    }
    local_68._M_head_impl = (PublicationObject *)0x0;
    if (local_70 != (PublicationObject *)0x0) {
      std::default_delete<helics::PublicationObject>::operator()
                ((default_delete<helics::PublicationObject> *)&local_70,local_70);
    }
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  return pvVar5;
}

Assistant:

HelicsPublication
    helicsFederateRegisterGlobalTypePublication(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &fedObj->registerGlobalPublication(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}